

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

void __thiscall Clasp::Solver::ccResolve(Solver *this,LitVec *cc,uint32 pos,LitVec *reason)

{
  size_type *psVar1;
  pointer pDVar2;
  uint *puVar3;
  uint uVar4;
  pointer pLVar5;
  pointer puVar6;
  ulong in_RAX;
  uint uVar7;
  ulong uVar8;
  long *plVar9;
  undefined8 uStack_38;
  
  plVar9 = (long *)((this->heuristic_).ptr_ & 0xfffffffffffffffe);
  uStack_38 = in_RAX;
  (**(code **)(*plVar9 + 0x50))(plVar9,this,reason,(cc->ebo_).buf[pos].rep_);
  if ((reason->ebo_).size != 0) {
    uVar8 = 0;
    do {
      uVar7 = (reason->ebo_).buf[uVar8].rep_;
      uVar4 = *(uint *)((long)(this->assign_).assign_.ebo_.buf + (ulong)(uVar7 & 0xfffffffc));
      if ((uVar4 & 0xc) == 0) {
        pDVar2 = (this->levels_).super_type.ebo_.buf + ((uVar4 >> 4) - 1);
        *(uint *)pDVar2 = *(uint *)pDVar2 | 0x40000000;
        uStack_38 = CONCAT44(uVar7,(undefined4)uStack_38) & 0xfffffffeffffffff ^ 0x200000000;
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                  (cc,(Literal *)((long)&uStack_38 + 4));
      }
      uVar7 = (int)uVar8 + 1;
      uVar8 = (ulong)uVar7;
    } while (uVar7 != (reason->ebo_).size);
  }
  pLVar5 = (cc->ebo_).buf;
  puVar6 = (this->assign_).assign_.ebo_.buf;
  puVar3 = (uint *)((long)puVar6 + (ulong)(pLVar5[pos].rep_ & 0xfffffffc));
  *puVar3 = *puVar3 & 0xfffffff3;
  pDVar2 = (this->levels_).super_type.ebo_.buf +
           ((*(uint *)((long)puVar6 + (ulong)(pLVar5[pos].rep_ & 0xfffffffc)) >> 4) - 1);
  *(uint *)pDVar2 = *(uint *)pDVar2 & 0xbfffffff;
  pLVar5 = (cc->ebo_).buf;
  pLVar5[pos].rep_ = pLVar5[(cc->ebo_).size - 1].rep_;
  psVar1 = &(cc->ebo_).size;
  *psVar1 = *psVar1 - 1;
  return;
}

Assistant:

void Solver::ccResolve(LitVec& cc, uint32 pos, const LitVec& reason) {
	heuristic_->updateReason(*this, reason, cc[pos]);
	Literal x;
	for (LitVec::size_type i = 0; i != reason.size(); ++i) {
		x = reason[i];
		assert(isTrue(x));
		if (!seen(x.var())) {
			markLevel(level(x.var()));
			cc.push_back(~x);
		}
	}
	clearSeen(cc[pos].var());
	unmarkLevel(level(cc[pos].var()));
	cc[pos] = cc.back();
	cc.pop_back();
}